

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactorRational::vSolveRight4update
          (CLUFactorRational *this,Rational *vec,int *idx,Rational *rhs,int *ridx,int rn,
          Rational *forest,int *forestNum,int *forestIdx)

{
  long lVar1;
  rational_type *prVar2;
  int iVar3;
  long in_RCX;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_RDI;
  int *in_R8;
  undefined4 in_R9D;
  int *unaff_retaddr;
  Rational *in_stack_00000008;
  CLUFactorRational *in_stack_00000010;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  Rational x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  Rational x;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int local_170;
  int local_16c;
  Rational local_168;
  int local_11c [5];
  int *local_108;
  long local_100;
  int local_f4;
  Status local_f0;
  int local_ec;
  int local_e8 [13];
  int in_stack_ffffffffffffff4c;
  int *in_stack_ffffffffffffff50;
  Rational *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *prVar4;
  int iVar5;
  int *in_stack_ffffffffffffff90;
  Rational *in_stack_ffffffffffffff98;
  CLUFactorRational *in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffe8;
  int rn_00;
  int *in_stack_fffffffffffffff0;
  Rational *in_stack_fffffffffffffff8;
  
  prVar4 = in_RDI;
  iVar3 = vSolveLright((CLUFactorRational *)CONCAT44(in_R9D,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
                      );
  if (in_stack_00000008 == (Rational *)0x0) {
    in_stack_ffffffffffffff98 = &local_168;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x1e0384);
    lVar1 = *(long *)&in_RDI[2].m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_limbs;
    local_170 = 0;
    for (local_16c = 0; rn_00 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
        iVar5 = (int)((ulong)prVar4 >> 0x20), local_16c < iVar3; local_16c = local_16c + 1) {
      iVar5 = in_R8[local_16c];
      in_stack_ffffffffffffffa0 = (CLUFactorRational *)(in_RCX + (long)iVar5 * 0x40);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=(in_RDI,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe6f,
                                     CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)))
      ;
      in_stack_fffffffffffffe6e =
           boost::multiprecision::operator!=
                     ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)(ulong)(uint)in_stack_fffffffffffffe78,(int *)in_RDI);
      if ((bool)in_stack_fffffffffffffe6e) {
        enQueueMaxRat(in_R8,&local_170,*(int *)(lVar1 + (long)iVar5 * 4));
      }
      else {
        in_stack_fffffffffffffe78 = 0;
        in_stack_fffffffffffffff8 = (Rational *)&stack0xfffffffffffffe78;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=(in_RDI,CONCAT17(in_stack_fffffffffffffe6f,
                                    CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
      }
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x1e0502);
  }
  else {
    in_stack_ffffffffffffff90 = local_e8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x1e012b);
    local_108 = rperm_1;
    prVar2 = &in_RDI[2].m_value;
    local_100._0_4_ =
         (prVar2->den).m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_limbs;
    local_100._4_1_ =
         (prVar2->den).m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_sign;
    local_100._5_1_ =
         (prVar2->den).m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal;
    local_100._6_1_ =
         (prVar2->den).m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_alias;
    local_100._7_1_ =
         (prVar2->den).m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .field_0x17;
    local_f0 = OK;
    for (local_ec = 0; rn_00 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
        iVar5 = (int)((ulong)prVar4 >> 0x20), local_ec < iVar3; local_ec = local_ec + 1) {
      local_f4 = in_R8[local_ec];
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=(in_RDI,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe6f,
                                     CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)))
      ;
      local_11c[1] = 0;
      in_stack_fffffffffffffe6f =
           boost::multiprecision::operator!=
                     ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),(int *)in_RDI
                     );
      if ((bool)in_stack_fffffffffffffe6f) {
        *local_108 = local_f4;
        local_108 = local_108 + 1;
        enQueueMaxRat(in_R8,(int *)&local_f0,*(int *)(local_100 + (long)local_f4 * 4));
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=(in_RDI,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe6f,
                                       CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)
                                      ));
      }
      else {
        local_11c[0] = 0;
        in_stack_ffffffffffffffe8 = in_RCX + (long)local_f4 * 0x40;
        in_stack_fffffffffffffff0 = local_11c;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=(in_RDI,CONCAT17(in_stack_fffffffffffffe6f,
                                    CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
      }
    }
    in_stack_00000010->stat = local_f0;
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x1e0365);
  }
  iVar3 = vSolveUright(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                       in_stack_fffffffffffffff0,rn_00);
  if (*(int *)((long)&in_RDI[4].m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data + 8) == 0) {
    iVar3 = vSolveUpdateRight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90,iVar5);
  }
  return iVar3;
}

Assistant:

inline int CLUFactorRational::vSolveRight4update(Rational* vec,
      int* idx,                              /* result */
      Rational* rhs, int* ridx, int rn,                    /* rhs    */
      Rational* forest, int* forestNum, int* forestIdx)
{
   rn = vSolveLright(rhs, ridx, rn);

   /*  turn index list into a heap
    */

   if(forest)
   {
      Rational x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(x != 0)
         {
            enQueueMaxRat(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      Rational x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(x != 0)
            enQueueMaxRat(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn);

   return rn;
}